

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simplex_tree.h
# Opt level: O2

bool __thiscall
Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>::
reverse_lexicographic_order
          (Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence> *this,
          Simplex_handle *sh1,Simplex_handle *sh2)

{
  short sVar1;
  Key_simplex_base *__return_storage_ptr__;
  Key_simplex_base *pKVar2;
  short sVar3;
  pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>_>_>
  *__return_storage_ptr___00;
  pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>_>_>
  *ppVar4;
  Simplex_vertex_range rg2;
  Simplex_vertex_range rg1;
  Simplex_handle local_68;
  Simplex_handle local_60;
  pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>_>_>
  local_58;
  Key_simplex_base *local_28;
  short local_20;
  
  local_60 = (Simplex_handle)sh1->m_ptr;
  __return_storage_ptr__ = &local_58.second.super_Key_simplex_base;
  simplex_vertex_range((Simplex_vertex_range *)__return_storage_ptr__,this,&local_60);
  local_68 = (Simplex_handle)sh2->m_ptr;
  __return_storage_ptr___00 = &local_58;
  simplex_vertex_range((Simplex_vertex_range *)__return_storage_ptr___00,this,&local_68);
  while( true ) {
    __return_storage_ptr__ = *(Key_simplex_base **)__return_storage_ptr__;
    __return_storage_ptr___00 =
         (pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>_>_>
          *)(((iterator_range_base<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>_>,_boost::iterators::incrementable_traversal_tag>
               *)&__return_storage_ptr___00->first)->m_Begin).sib_;
    pKVar2 = local_28;
    ppVar4 = __return_storage_ptr___00;
    sVar3 = local_20;
    sVar1 = (Vertex_handle)
            local_58.second.super_Filtration_simplex_base.filt_.
            super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>.
            _M_impl.super__Vector_impl_data._M_start;
    if (((short)local_58.second.children_ == local_20 && __return_storage_ptr__ == local_28) ||
       (pKVar2 = __return_storage_ptr__,
       ppVar4 = (pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>_>_>
                 *)local_58.second.super_Filtration_simplex_base.filt_.
                   super_vector<int,_std::allocator<int>_>.
                   super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                   _M_finish, sVar3 = (short)local_58.second.children_,
       sVar1 = (short)local_58.second.super_Filtration_simplex_base.filt_.
                      super_vector<int,_std::allocator<int>_>.
                      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                      _M_end_of_storage,
       (Vertex_handle)
       local_58.second.super_Filtration_simplex_base.filt_.super_vector<int,_std::allocator<int>_>.
       super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start ==
       (short)local_58.second.super_Filtration_simplex_base.filt_.
              super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage &&
       __return_storage_ptr___00 ==
       (pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>_>_>
        *)local_58.second.super_Filtration_simplex_base.filt_.
          super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>.
          _M_impl.super__Vector_impl_data._M_finish)) break;
    if ((short)local_58.second.children_ !=
        (Vertex_handle)
        local_58.second.super_Filtration_simplex_base.filt_.super_vector<int,_std::allocator<int>_>.
        super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start) {
      return (short)local_58.second.children_ <
             (Vertex_handle)
             local_58.second.super_Filtration_simplex_base.filt_.
             super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>.
             _M_impl.super__Vector_impl_data._M_start;
    }
    local_58.second.children_._0_2_ = *(short *)(__return_storage_ptr__ + 2);
    local_58.second.super_Filtration_simplex_base.filt_.super_vector<int,_std::allocator<int>_>.
    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start._0_2_ =
         *(Vertex_handle *)
          &(__return_storage_ptr___00->second).super_Filtration_simplex_base.filt_.
           super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>.
           _M_impl.super__Vector_impl_data;
  }
  return (sVar3 == local_20 && pKVar2 == local_28) &&
         (sVar1 != (short)local_58.second.super_Filtration_simplex_base.filt_.
                          super_vector<int,_std::allocator<int>_>.
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage ||
         ppVar4 != (pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>_>_>
                    *)local_58.second.super_Filtration_simplex_base.filt_.
                      super_vector<int,_std::allocator<int>_>.
                      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                      _M_finish);
}

Assistant:

bool reverse_lexicographic_order(Simplex_handle sh1, Simplex_handle sh2) const {
    Simplex_vertex_range rg1 = simplex_vertex_range(sh1);
    Simplex_vertex_range rg2 = simplex_vertex_range(sh2);
    Simplex_vertex_iterator it1 = rg1.begin();
    Simplex_vertex_iterator it2 = rg2.begin();
    while (it1 != rg1.end() && it2 != rg2.end()) {
      if (*it1 == *it2) {
        ++it1;
        ++it2;
      } else {
        return *it1 < *it2;
      }
    }
    return ((it1 == rg1.end()) && (it2 != rg2.end()));
  }